

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS ref_fixture_tri_qua_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  REF_INT RVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  int iVar15;
  int iVar16;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c [27];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    pcVar14 = "create";
    uVar7 = 0x1f7;
    goto LAB_0012f1ea;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 1;
  iVar10 = ref_mpi->n;
  iVar6 = ref_mpi->id;
  iVar8 = 0;
  iVar5 = (int)(4 / (long)iVar10);
  iVar15 = iVar5 * iVar10;
  if (4 < iVar15) {
    iVar8 = ((((iVar10 + 4) / iVar10) * (iVar15 + -5)) / iVar5 - iVar15) + 5;
  }
  if (iVar6 == iVar8) {
LAB_0012e842:
    uVar4 = ref_node_add(ref_node,0,&local_98);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar7 = 0x207;
      goto LAB_0012f1ea;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_98;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar12 = -1;
    if (((-1 < lVar13) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar12 = ref_node->global[lVar13];
    }
    iVar10 = ref_mpi->n;
    iVar6 = (iVar10 + 4) / iVar10;
    if (lVar12 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar12 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      RVar11 = (REF_INT)(lVar12 / (long)iVar6);
    }
    else {
      lVar12 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar5;
      RVar11 = iVar10 + (int)((lVar12 - iVar6 * iVar10) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar11;
    uVar4 = ref_node_add(ref_node,1,&local_94);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar7 = 0x208;
      goto LAB_0012f1ea;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_94;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar12 = -1;
    if (((-1 < lVar13) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar12 = ref_node->global[lVar13];
    }
    iVar10 = ref_mpi->n;
    iVar6 = (iVar10 + 4) / iVar10;
    if (lVar12 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar12 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      RVar11 = (REF_INT)(lVar12 / (long)iVar6);
    }
    else {
      lVar12 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar5;
      RVar11 = iVar10 + (int)((lVar12 - iVar6 * iVar10) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar11;
    uVar4 = ref_node_add(ref_node,2,&local_90);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar7 = 0x209;
      goto LAB_0012f1ea;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_90;
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar12 = -1;
    if (((-1 < lVar13) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar12 = ref_node->global[lVar13];
    }
    iVar10 = ref_mpi->n;
    iVar6 = (iVar10 + 4) / iVar10;
    if (lVar12 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar12 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      RVar11 = (REF_INT)(lVar12 / (long)iVar6);
    }
    else {
      lVar12 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar5;
      RVar11 = iVar10 + (int)((lVar12 - iVar6 * iVar10) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar11;
    uVar4 = ref_cell_add(pRVar1->cell[3],&local_98,&local_9c);
    if (uVar4 != 0) {
      pcVar14 = "add tri";
      uVar7 = 0x20b;
      goto LAB_0012f1ea;
    }
    iVar10 = ref_mpi->n;
    iVar6 = ref_mpi->id;
    iVar5 = (int)(4 / (long)iVar10);
    iVar15 = iVar5 * iVar10;
  }
  else {
    iVar9 = (iVar10 + 4) / iVar10;
    iVar8 = 0;
    if (iVar9 + 1U < 3) {
      iVar8 = iVar9;
    }
    iVar16 = 5 - iVar15;
    if (iVar16 <= iVar8) {
      iVar8 = (1 - iVar9 * iVar16) / iVar5 + iVar16;
    }
    if (iVar6 == iVar8) goto LAB_0012e842;
    iVar8 = (int)(2 / (long)iVar9);
    if (iVar16 <= iVar8) {
      iVar8 = (2 - iVar9 * iVar16) / iVar5 + iVar16;
    }
    if (iVar6 == iVar8) goto LAB_0012e842;
  }
  iVar8 = 0;
  if (4 < iVar15) {
    iVar8 = ((((iVar10 + 4) / iVar10) * (iVar15 + -5)) / iVar5 - iVar15) + 5;
  }
  if (iVar6 == iVar8) {
LAB_0012ecd0:
    uVar4 = ref_node_add(ref_node,0,&local_98);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar7 = 0x21b;
      goto LAB_0012f1ea;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_98;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar12 = -1;
    if (((-1 < lVar13) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar12 = ref_node->global[lVar13];
    }
    iVar10 = ref_mpi->n;
    iVar6 = (iVar10 + 4) / iVar10;
    if (lVar12 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar12 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      RVar11 = (REF_INT)(lVar12 / (long)iVar6);
    }
    else {
      lVar12 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar5;
      RVar11 = iVar10 + (int)((lVar12 - iVar6 * iVar10) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar11;
    uVar4 = ref_node_add(ref_node,4,&local_94);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar7 = 0x21c;
      goto LAB_0012f1ea;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_94;
    pRVar3[lVar13 * 0xf] = -1.0;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar12 = -1;
    if (((-1 < lVar13) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar12 = ref_node->global[lVar13];
    }
    iVar10 = ref_mpi->n;
    iVar6 = (iVar10 + 4) / iVar10;
    if (lVar12 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar12 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      RVar11 = (REF_INT)(lVar12 / (long)iVar6);
    }
    else {
      lVar12 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar5;
      RVar11 = iVar10 + (int)((lVar12 - iVar6 * iVar10) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar11;
    uVar4 = ref_node_add(ref_node,3,&local_90);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar7 = 0x21d;
      goto LAB_0012f1ea;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_90;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = -1.0;
    pRVar3[1] = 1.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar12 = -1;
    if (((-1 < lVar13) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar12 = ref_node->global[lVar13];
    }
    iVar10 = ref_mpi->n;
    iVar6 = (iVar10 + 4) / iVar10;
    if (lVar12 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar12 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      RVar11 = (REF_INT)(lVar12 / (long)iVar6);
    }
    else {
      lVar12 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar5;
      RVar11 = iVar10 + (int)((lVar12 - iVar6 * iVar10) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar11;
    uVar4 = ref_node_add(ref_node,1,local_8c);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar7 = 0x21e;
      goto LAB_0012f1ea;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_8c[0];
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar12 = -1;
    if (((-1 < lVar13) && (local_8c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar12 = ref_node->global[lVar13];
    }
    iVar10 = ref_mpi->n;
    iVar6 = (iVar10 + 4) / iVar10;
    if (lVar12 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar10) + 1)) {
      lVar12 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      RVar11 = (REF_INT)(lVar12 / (long)iVar6);
    }
    else {
      lVar12 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar12 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar12 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar10);
      iVar10 = 5 - iVar10 * iVar5;
      RVar11 = iVar10 + (int)((lVar12 - iVar6 * iVar10) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar11;
    uVar4 = ref_cell_add(pRVar1->cell[6],&local_98,&local_9c);
    if (uVar4 != 0) {
      pcVar14 = "add tri";
      uVar7 = 0x220;
      goto LAB_0012f1ea;
    }
  }
  else {
    iVar10 = (iVar10 + 4) / iVar10;
    iVar8 = (int)(4 / (long)iVar10);
    iVar15 = 5 - iVar15;
    if (iVar15 <= iVar8) {
      iVar8 = (4 - iVar10 * iVar15) / iVar5 + iVar15;
    }
    if (iVar6 == iVar8) goto LAB_0012ecd0;
    iVar8 = (int)(3 / (long)iVar10);
    if (iVar15 <= iVar8) {
      iVar8 = (3 - iVar10 * iVar15) / iVar5 + iVar15;
    }
    if (iVar6 == iVar8) goto LAB_0012ecd0;
    iVar8 = 0;
    if (iVar10 + 1U < 3) {
      iVar8 = iVar10;
    }
    if (iVar15 <= iVar8) {
      iVar8 = (1 - iVar10 * iVar15) / iVar5 + iVar15;
    }
    if (iVar6 == iVar8) goto LAB_0012ecd0;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,5);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar14 = "init glob";
  uVar7 = 0x223;
LAB_0012f1ea:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar7,
         "ref_fixture_tri_qua_grid",(ulong)uVar4,pcVar14);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tri_qua_grid(REF_GRID *ref_grid_ptr,
                                            REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 5;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 0.0, 1.0, 0.0);
    add_that_node(2, 1.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 0;
  global[1] = 4;
  global[2] = 3;
  global[3] = 1;
  global[4] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, -1.0, 0.0, 0.0);
    add_that_node(2, -1.0, 1.0, 0.0);
    add_that_node(3, 0.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}